

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O2

bool delaunator::in_circle
               (double ax,double ay,double bx,double by,double cx,double cy,double px,double py)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = ax - px;
  dVar2 = ay - py;
  dVar3 = bx - px;
  dVar5 = by - py;
  dVar6 = cx - px;
  dVar7 = cy - py;
  dVar8 = dVar6 * dVar6 + dVar7 * dVar7;
  dVar4 = dVar3 * dVar3 + dVar5 * dVar5;
  return (dVar7 * dVar3 - dVar6 * dVar5) * (dVar1 * dVar1 + dVar2 * dVar2) +
         ((dVar5 * dVar8 - dVar7 * dVar4) * dVar1 - (dVar8 * dVar3 - dVar4 * dVar6) * dVar2) < 0.0;
}

Assistant:

inline bool in_circle(
    const double ax,
    const double ay,
    const double bx,
    const double by,
    const double cx,
    const double cy,
    const double px,
    const double py) {
    const double dx = ax - px;
    const double dy = ay - py;
    const double ex = bx - px;
    const double ey = by - py;
    const double fx = cx - px;
    const double fy = cy - py;

    const double ap = dx * dx + dy * dy;
    const double bp = ex * ex + ey * ey;
    const double cp = fx * fx + fy * fy;

    return (dx * (ey * cp - bp * fy) -
            dy * (ex * cp - bp * fx) +
            ap * (ex * fy - ey * fx)) < 0.0;
}